

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall QMdiSubWindow::paintEvent(QMdiSubWindow *this,QPaintEvent *paintEvent)

{
  QStyleOptionTitleBar *pQVar1;
  int iVar2;
  long lVar3;
  QMdiSubWindowPrivate *this_00;
  QWidgetData *pQVar4;
  qsizetype qVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  QStyle *pQVar12;
  QWidget *pQVar13;
  QWidgetPrivate *pQVar14;
  int iVar15;
  long in_FS_OFFSET;
  QRect QVar16;
  ulong local_d8;
  undefined8 local_d0;
  undefined1 *local_c8;
  QWidget *pQStack_c0;
  QStyle *local_b8;
  QStyleOptionFrame frameOptions;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiSubWindowPrivate **)&(this->super_QWidget).field_0x8;
  if ((*(long *)&(this_00->super_QWidgetPrivate).field_0x10 == 0) ||
     (((((this->super_QWidget).data)->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 0x800) != 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
      QWidget::paintEvent(&this->super_QWidget,paintEvent);
      return;
    }
    goto LAB_0041bee6;
  }
  if ((this_00->resizeTimer).m_id == Invalid) {
    QMdiSubWindowPrivate::titleBarOptions((QStyleOptionTitleBar *)&frameOptions,this_00);
    QStyleOptionTitleBar::operator=
              (&this_00->cachedStyleOptions,(QStyleOptionTitleBar *)&frameOptions);
    QStyleOptionTitleBar::~QStyleOptionTitleBar((QStyleOptionTitleBar *)&frameOptions);
  }
  else {
    pQVar1 = &this_00->cachedStyleOptions;
    bVar8 = QMdiSubWindowPrivate::hasBorder(this_00,pQVar1);
    iVar15 = (uint)!bVar8 * 4 + -4;
    iVar10 = QMdiSubWindowPrivate::titleBarHeight(this_00,pQVar1);
    bVar9 = QWidget::isMinimized(&this->super_QWidget);
    pQVar4 = (this->super_QWidget).data;
    iVar11 = (pQVar4->crect).x2.m_i;
    iVar2 = (pQVar4->crect).x1.m_i;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.x1.m_i =
         (uint)bVar8 * 4;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.y1.m_i =
         (uint)bVar8 * 4;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.x2.m_i =
         (iVar15 + iVar11) - iVar2;
    (this_00->cachedStyleOptions).super_QStyleOptionComplex.super_QStyleOption.rect.y2.m_i =
         iVar10 + (uint)bVar8 * 4 + (iVar15 << bVar9) + -1;
    if ((this_00->windowTitle).d.size != 0) {
      pQVar12 = QWidget::style(&this->super_QWidget);
      (**(code **)(*(long *)pQVar12 + 0xd8))(pQVar12,5,pQVar1,0x100,this);
      QFontMetrics::elidedText((QString *)&frameOptions,(int)this_00 + 0x408,(int)this_00 + 0x3b8,1)
      ;
      pDVar6 = (this_00->cachedStyleOptions).text.d.d;
      pcVar7 = (this_00->cachedStyleOptions).text.d.ptr;
      (this_00->cachedStyleOptions).text.d.d = (Data *)frameOptions.super_QStyleOption._0_8_;
      (this_00->cachedStyleOptions).text.d.ptr = (char16_t *)frameOptions.super_QStyleOption._8_8_;
      qVar5 = (this_00->cachedStyleOptions).text.d.size;
      (this_00->cachedStyleOptions).text.d.size = frameOptions.super_QStyleOption.rect._0_8_;
      frameOptions.super_QStyleOption._0_8_ = pDVar6;
      frameOptions.super_QStyleOption._8_8_ = pcVar7;
      frameOptions.super_QStyleOption.rect._0_8_ = qVar5;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&frameOptions);
    }
  }
  local_b8 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_c0 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)&local_c8,&this->super_QWidget);
  frameOptions._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  frameOptions._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  frameOptions.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionFrame::QStyleOptionFrame(&frameOptions);
  QStyleOption::initFrom(&frameOptions.super_QStyleOption,&this->super_QWidget);
  frameOptions.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       ((uint)this_00->isActive << 0x10 |
       (uint)frameOptions.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i & 0xfffeffff);
  bVar8 = QWidget::isMaximized(&this->super_QWidget);
  if ((!bVar8) || (bVar8 = QMdiSubWindowPrivate::drawTitleBarWhenMaximized(this_00), bVar8)) {
    if ((this_00->windowTitle).d.size != 0) {
      QPainter::setFont((QFont *)&local_c8);
    }
    pQVar1 = &this_00->cachedStyleOptions;
    QStylePainter::drawComplexControl
              ((QStylePainter *)&local_c8,CC_TitleBar,&pQVar1->super_QStyleOptionComplex);
    bVar8 = QWidget::isMinimized(&this->super_QWidget);
    if ((!bVar8) || (bVar8 = QMdiSubWindowPrivate::hasBorder(this_00,pQVar1), bVar8)) {
      pQVar12 = QWidget::style(&this->super_QWidget);
      iVar11 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,0x2c,0,this);
      frameOptions.lineWidth = iVar11;
      bVar8 = QWidget::isMinimized(&this->super_QWidget);
      if ((!bVar8) && (bVar8 = QMdiSubWindowPrivate::hasBorder(this_00,pQVar1), !bVar8)) {
        QVar16 = QWidget::rect(&this->super_QWidget);
        iVar11 = QMdiSubWindowPrivate::titleBarHeight(this_00,pQVar1);
        local_d8 = QVar16._0_8_ & 0xffffffff | (ulong)(uint)(QVar16.y1.m_i.m_i + iVar11) << 0x20;
        local_d0 = QVar16._8_8_;
        QPainter::setClipRect((QRect *)&local_c8,(ClipOperation)&local_d8);
      }
      bVar8 = QWidget::isMinimized(&this->super_QWidget);
      if ((!bVar8) || (bVar8 = QMdiSubWindowPrivate::hasBorder(this_00,pQVar1), bVar8))
      goto LAB_0041be9b;
    }
  }
  else {
    bVar8 = QWidget::autoFillBackground(&this->super_QWidget);
    if (!bVar8) {
      pQVar13 = widget(this);
      if (pQVar13 != (QWidget *)0x0) {
        pQVar13 = widget(this);
        pQVar14 = qt_widget_private(pQVar13);
        if ((pQVar14->field_0x252 & 2) != 0) goto LAB_0041bead;
      }
LAB_0041be9b:
      QStylePainter::drawPrimitive
                ((QStylePainter *)&local_c8,PE_FrameWindow,&frameOptions.super_QStyleOption);
    }
  }
LAB_0041bead:
  QStyleOption::~QStyleOption(&frameOptions.super_QStyleOption);
  QPainter::~QPainter((QPainter *)&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
LAB_0041bee6:
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindow::paintEvent(QPaintEvent *paintEvent)
{
    if (!parent() || (windowFlags() & Qt::FramelessWindowHint)) {
        QWidget::paintEvent(paintEvent);
        return;
    }

    Q_D(QMdiSubWindow);

    if (d->resizeTimer.isActive()) {
        // Only update the style option rect and the window title.
        int border = d->hasBorder(d->cachedStyleOptions) ? 4 : 0;
        int titleBarHeight = d->titleBarHeight(d->cachedStyleOptions);
        titleBarHeight -= isMinimized() ? 2 * border : border;
        d->cachedStyleOptions.rect = QRect(border, border, width() - 2 * border, titleBarHeight);
        if (!d->windowTitle.isEmpty()) {
            int width = style()->subControlRect(QStyle::CC_TitleBar, &d->cachedStyleOptions,
                                                QStyle::SC_TitleBarLabel, this).width();
            d->cachedStyleOptions.text = d->cachedStyleOptions.fontMetrics
                                         .elidedText(d->windowTitle, Qt::ElideRight, width);
        }
    } else {
        // Force full update.
        d->cachedStyleOptions = d->titleBarOptions();
    }

    QStylePainter painter(this);
    QStyleOptionFrame frameOptions;
    frameOptions.initFrom(this);
    frameOptions.state.setFlag(QStyle::State_Active, d->isActive);
    if (isMaximized() && !d->drawTitleBarWhenMaximized()) {
        if (!autoFillBackground() && (!widget() || !qt_widget_private(widget())->isOpaque)) {
            // make sure we paint all pixels of a maximized QMdiSubWindow if no-one else does
            painter.drawPrimitive(QStyle::PE_FrameWindow, frameOptions);
        }
        return;
    }

    if (!d->windowTitle.isEmpty())
        painter.setFont(d->font);
    painter.drawComplexControl(QStyle::CC_TitleBar, d->cachedStyleOptions);

    if (isMinimized() && !d->hasBorder(d->cachedStyleOptions))
        return;

    frameOptions.lineWidth = style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, this);

    // ### Ensure that we do not require setting the cliprect for 4.4
    if (!isMinimized() && !d->hasBorder(d->cachedStyleOptions))
        painter.setClipRect(rect().adjusted(0, d->titleBarHeight(d->cachedStyleOptions), 0, 0));
    if (!isMinimized() || d->hasBorder(d->cachedStyleOptions))
        painter.drawPrimitive(QStyle::PE_FrameWindow, frameOptions);
}